

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balance.hpp
# Opt level: O3

void print_dynamic_assigner(Master *master,DynamicAssigner *dynamic_assigner)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  FILE *f;
  uint uVar4;
  ulong uVar5;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  ulong local_58 [2];
  ulong local_48;
  
  local_58[0] = 0;
  format_str.size_ = 0x11;
  format_str.data_ = "DynamicAssigner: ";
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_58;
  fmt::v7::vprint(_stderr,format_str,(format_args)(auVar2 << 0x40));
  if ((int)((ulong)((long)(master->blocks_).elements_.
                          super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(master->blocks_).elements_.
                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) != 0) {
    uVar5 = 0;
    do {
      f = _stderr;
      uVar1 = (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      uVar4 = (*(dynamic_assigner->super_Assigner)._vptr_Assigner[3])(dynamic_assigner,(ulong)uVar1)
      ;
      local_48 = (ulong)uVar4;
      format_str_00.size_ = 0x17;
      format_str_00.data_ = "[gid, proc] = [{}, {}] ";
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           local_58;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = 0x11;
      local_58[0] = (ulong)uVar1;
      fmt::v7::vprint(f,format_str_00,args);
      uVar5 = uVar5 + 1;
    } while (uVar5 < ((ulong)((long)(master->blocks_).elements_.
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(master->blocks_).elements_.
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3 & 0xffffffff));
  }
  local_58[0] = 0;
  format_str_01.size_ = 1;
  format_str_01.data_ = "\n";
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_58;
  fmt::v7::vprint(_stderr,format_str_01,(format_args)(auVar3 << 0x40));
  return;
}

Assistant:

void print_dynamic_assigner(const diy::Master&            master,
                            const diy::DynamicAssigner&   dynamic_assigner)
{
    fmt::print(stderr, "DynamicAssigner: ");
    for (auto i = 0; i < master.size(); i++)
        fmt::print(stderr, "[gid, proc] = [{}, {}] ", master.gid(i), dynamic_assigner.rank(master.gid(i)));
    fmt::print(stderr, "\n");
}